

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

int __thiscall raspicam::_private::Private_Impl_Still::initialize(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  Private_Impl_Still *in_RDI;
  Private_Impl_Still *unaff_retaddr;
  Private_Impl_Still *in_stack_00000028;
  Private_Impl_Still *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if ((in_RDI->_isInitialized & 1U) == 0) {
    this_00 = in_RDI;
    iVar3 = createCamera(in_stack_00000028);
    if (iVar3 == 0) {
      iVar3 = createEncoder(in_RDI);
      if (iVar3 == 0) {
        in_RDI->camera_still_port = in_RDI->camera->output[2];
        in_RDI->encoder_input_port = *in_RDI->encoder->input;
        in_RDI->encoder_output_port = *in_RDI->encoder->output;
        MVar1 = connectPorts(unaff_retaddr,
                             (MMAL_PORT_T *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (MMAL_PORT_T *)this_00,(MMAL_CONNECTION_T **)in_RDI);
        if (MVar1 == MMAL_SUCCESS) {
          in_RDI->_isInitialized = true;
          iVar3 = 0;
        }
        else {
          std::operator<<((ostream *)&std::cout,"ERROR: Could not connect encoder ports!\n");
          iVar3 = -1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
        std::operator<<(poVar2,": Failed to create encoder component.\n");
        destroyCamera(this_00);
        iVar3 = -1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar2,": Failed to create camera component.\n");
      destroyCamera(this_00);
      iVar3 = -1;
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Private_Impl_Still::initialize() {
            if ( _isInitialized ) return 0;
            if ( createCamera() ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            } else if ( createEncoder() ) {
                cout << API_NAME << ": Failed to create encoder component.\n";
                destroyCamera();
                return -1;
            } else {
                camera_still_port	= camera->output[MMAL_CAMERA_CAPTURE_PORT];
                encoder_input_port  = encoder->input[0];
                encoder_output_port = encoder->output[0];
                if ( connectPorts ( camera_still_port, encoder_input_port, &encoder_connection ) != MMAL_SUCCESS ) {
                    cout << "ERROR: Could not connect encoder ports!\n";
                    return -1;
                }
            }
            _isInitialized=true;
            return 0;
        }